

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O1

void do_oedit(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  int iVar2;
  PC_DATA *pPVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  OBJ_INDEX_DATA *pOVar7;
  DESCRIPTOR_DATA *pDVar8;
  AREA_DATA_conflict *pAVar9;
  char *pcVar10;
  char arg1 [4608];
  char local_1238 [4616];
  
  bVar4 = is_npc(ch);
  if (bVar4) {
    return;
  }
  bVar4 = check_security(ch);
  if (!bVar4) {
    return;
  }
  pcVar6 = one_argument(argument,local_1238);
  iVar5 = 0;
  if (local_1238[0] == '\0') {
    iVar1 = ch->pcdata->editing_item;
    iVar5 = 0;
    if (0 < iVar1) {
      iVar5 = iVar1;
    }
  }
  bVar4 = is_number(local_1238);
  if ((bVar4) || (iVar5 != 0)) {
    if (iVar5 == 0) {
      iVar5 = atoi(local_1238);
    }
    pOVar7 = get_obj_index(0);
    if (pOVar7 == (OBJ_INDEX_DATA *)0x0) {
      pcVar6 = "OEdit:  That vnum does not exist.\n\r";
      goto LAB_0035b6a8;
    }
    bVar4 = is_switched(ch);
    if (!bVar4) {
      pPVar3 = ch->pcdata;
      iVar1 = pPVar3->security;
      pAVar9 = pOVar7->area;
      iVar2 = pAVar9->security;
      if ((((iVar2 < iVar1) || (pcVar6 = strstr(pAVar9->builders,ch->name), iVar2 < iVar1)) ||
          (pcVar6 != (char *)0x0)) ||
         (pcVar6 = strstr(pAVar9->builders,"All"), pcVar6 != (char *)0x0)) {
        pDVar8 = ch->desc;
        pDVar8->pEdit = pOVar7;
        pPVar3->editing_item = iVar5;
LAB_0035b73f:
        pDVar8->editor = 3;
        oedit_show(ch,"");
        return;
      }
    }
  }
  else {
    bVar4 = str_cmp(local_1238,"create");
    if (bVar4) {
      pcVar6 = "OEdit:  There is no default object to edit.\n\r";
      goto LAB_0035b6a8;
    }
    iVar5 = atoi(pcVar6);
    if (iVar5 == 0 || *pcVar6 == '\0') {
      pcVar6 = "Syntax:  edit object create [vnum]\n\r";
      goto LAB_0035b6a8;
    }
    pAVar9 = get_vnum_area(iVar5);
    if (pAVar9 == (AREA_DATA_conflict *)0x0) {
      pcVar6 = "OEdit:  That vnum is not assigned an area.\n\r";
      goto LAB_0035b6a8;
    }
    bVar4 = is_switched(ch);
    if (!bVar4) {
      iVar5 = ch->pcdata->security;
      iVar1 = pAVar9->security;
      if (((iVar1 < iVar5) || (pcVar10 = strstr(pAVar9->builders,ch->name), iVar1 < iVar5)) ||
         ((pcVar10 != (char *)0x0 ||
          (pcVar10 = strstr(pAVar9->builders,"All"), pcVar10 != (char *)0x0)))) {
        bVar4 = oedit_create(ch,pcVar6);
        if (!bVar4) {
          return;
        }
        *(byte *)pAVar9->area_flags = (byte)pAVar9->area_flags[0] | 8;
        pDVar8 = ch->desc;
        goto LAB_0035b73f;
      }
    }
  }
  pcVar6 = "Insufficient security to modify object.\n\r";
LAB_0035b6a8:
  send_to_char(pcVar6,ch);
  return;
}

Assistant:

void do_oedit(CHAR_DATA *ch, char *argument)
{
	OBJ_INDEX_DATA *pObj;
	AREA_DATA *pArea;
	char arg1[MAX_STRING_LENGTH];
	int value = 0;

	if (is_npc(ch))
		return;

	if (!check_security(ch))
		return;

	argument = one_argument(argument, arg1);

	if (!strcmp(arg1, "") && ch->pcdata->editing_item > 0)
		value = ch->pcdata->editing_item;

	if (is_number(arg1) || value > 0)
	{
		if (value == 0)
			value = atoi(arg1);

		if (!(pObj = get_obj_index(value)))
		{
			send_to_char("OEdit:  That vnum does not exist.\n\r", ch);
			return;
		}

		if (!IS_BUILDER(ch, pObj->area))
		{
			send_to_char("Insufficient security to modify object.\n\r", ch);
			return;
		}

		ch->desc->pEdit = (void *)pObj;
		ch->pcdata->editing_item = value;
		ch->desc->editor = ED_OBJECT;

		oedit_show(ch, "");
		return;
	}
	else
	{
		if (!str_cmp(arg1, "create"))
		{
			value = atoi(argument);

			if (argument[0] == '\0' || value == 0)
			{
				send_to_char("Syntax:  edit object create [vnum]\n\r", ch);
				return;
			}

			pArea = get_vnum_area(value);

			if (!pArea)
			{
				send_to_char("OEdit:  That vnum is not assigned an area.\n\r", ch);
				return;
			}

			if (!IS_BUILDER(ch, pArea))
			{
				send_to_char("Insufficient security to modify object.\n\r", ch);
				return;
			}

			if (oedit_create(ch, argument))
			{
				SET_BIT(pArea->area_flags, AREA_CHANGED);
				ch->desc->editor = ED_OBJECT;
				oedit_show(ch, "");
			}

			return;
		}
	}

	send_to_char("OEdit:  There is no default object to edit.\n\r", ch);
}